

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::PointSizeCase::iterate(PointSizeCase *this)

{
  bool bVar1;
  undefined1 local_28 [8];
  Surface resultImage;
  PointSizeCase *this_local;
  
  resultImage.m_pixels.m_cap = (size_t)this;
  tcu::Surface::Surface((Surface *)local_28,0x20,0x20);
  renderTo(this,(Surface *)local_28);
  bVar1 = verifyImage(this,(Surface *)local_28);
  if (bVar1) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Image verification failed");
  }
  tcu::Surface::~Surface((Surface *)local_28);
  return STOP;
}

Assistant:

PointSizeCase::IterateResult PointSizeCase::iterate (void)
{
	tcu::Surface resultImage(RENDER_SIZE, RENDER_SIZE);

	renderTo(resultImage);

	if (verifyImage(resultImage))
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");

	return STOP;
}